

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distance.cpp
# Opt level: O3

double Distance::getRobinsonFouldsDistance(PhyloTree *t1,PhyloTree *t2,bool normalise)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> enic;
  double local_48;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_38;
  
  local_38.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PhyloTree::getEdgesNotInCommonWith(t1,t2,&local_38);
  PhyloTree::getEdgesNotInCommonWith(t2,t1,&local_38);
  lVar3 = ((long)local_38.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_38.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
  auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar4._0_8_ = lVar3;
  auVar4._12_4_ = 0x45300000;
  local_48 = (auVar4._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
  if (normalise) {
    sVar1 = PhyloTree::numEdges(t1);
    sVar2 = PhyloTree::numEdges(t2);
    lVar3 = sVar2 + sVar1;
    auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar5._0_8_ = lVar3;
    auVar5._12_4_ = 0x45300000;
    local_48 = local_48 /
               ((auVar5._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
  }
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_38);
  return local_48;
}

Assistant:

double Distance::getRobinsonFouldsDistance(PhyloTree &t1, PhyloTree &t2, bool normalise) {
    double rf_value = 0;
    vector<PhyloTreeEdge> enic;
    t1.getEdgesNotInCommonWith(t2, enic);
    t2.getEdgesNotInCommonWith(t1, enic);
    rf_value = enic.size();
    if (normalise)
        rf_value /= t1.numEdges() + t2.numEdges();
    return rf_value;
}